

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::TestCase183::run(TestCase183 *this)

{
  bool bVar1;
  Stringable *in_RDX;
  Stringable *params;
  kj *in_RSI;
  Array<char> *this_00;
  Array<char> local_28;
  
  this_00 = &local_28;
  str<kj::_::(anonymous_namespace)::Stringable>((String *)this_00,in_RSI,in_RDX);
  bVar1 = operator==("foo",(String *)this_00);
  Array<char>::~Array(&local_28);
  if (!bVar1 && Debug::minSeverity < 3) {
    str<kj::_::(anonymous_namespace)::Stringable>((String *)&local_28,(kj *)this_00,params);
    Debug::log<char_const(&)[52],char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb8,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (kj::str(Stringable()))\", \"foo\", kj::str(Stringable())"
               ,(char (*) [52])"failed: expected (\"foo\") == (kj::str(Stringable()))",
               (char (*) [4])0x19609c,(String *)&local_28);
    Array<char>::~Array(&local_28);
  }
  return;
}

Assistant:

TEST(String, ToString) {
  EXPECT_EQ("foo", kj::str(Stringable()));
}